

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  char cVar7;
  size_t sVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  U32 UVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  BYTE *pBVar20;
  long *plVar21;
  U32 *hashTable;
  int iVar22;
  long *plVar23;
  uint local_94;
  
  uVar16 = cParams->searchLength;
  uVar17 = (ulong)cParams->targetLength;
  pUVar5 = ms->hashTable;
  pBVar6 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  pBVar20 = pBVar6 + uVar2;
  uVar3 = rep[1];
  plVar21 = (long *)((ulong)(pBVar20 == (BYTE *)src) + (long)src);
  uVar15 = (int)plVar21 - (int)pBVar20;
  local_94 = uVar3;
  if (uVar15 < uVar3) {
    local_94 = 0;
  }
  pInLimit = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  uVar4 = *rep;
  uVar19 = 0;
  if (uVar4 <= uVar15) {
    uVar19 = uVar4;
  }
  iVar22 = (int)pBVar6;
  cVar7 = (char)cParams->hashLog;
  if (uVar16 == 5) {
    bVar9 = 0x40 - cVar7;
    do {
      do {
        while( true ) {
          if (plVar1 <= plVar21) goto LAB_001517aa;
          uVar11 = (ulong)(*plVar21 * -0x30e4432345000000) >> (bVar9 & 0x3f);
          uVar14 = (long)plVar21 - (long)pBVar6;
          uVar16 = pUVar5[uVar11];
          UVar13 = (U32)uVar14;
          pUVar5[uVar11] = UVar13;
          if ((uVar19 != 0) &&
             (*(int *)((long)plVar21 + -(ulong)uVar19 + 1) == *(int *)((long)plVar21 + 1))) {
            plVar23 = (long *)((long)plVar21 + 1);
            sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 5),
                               (BYTE *)((long)plVar21 + -(ulong)uVar19 + 5),pInLimit);
            ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar8 + 1);
            uVar16 = uVar19;
            goto LAB_0015145c;
          }
          if ((uVar2 < uVar16) && (piVar12 = (int *)(pBVar6 + uVar16), *piVar12 == (int)*plVar21))
          break;
          plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + uVar17);
        }
        sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar12 + 1),pInLimit);
        uVar16 = (int)plVar21 - (int)piVar12;
        for (lVar18 = 0;
            ((plVar23 = (long *)(lVar18 + (long)plVar21), pBVar20 < (BYTE *)((long)piVar12 + lVar18)
             && (src < plVar23)) &&
            (*(char *)((long)plVar21 + lVar18 + -1) == *(char *)((long)piVar12 + lVar18 + -1)));
            lVar18 = lVar18 + -1) {
        }
        sVar8 = sVar8 - lVar18;
        ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar16 + 2,sVar8 + 1);
        local_94 = uVar19;
LAB_0015145c:
        uVar19 = uVar16;
        src = (void *)(sVar8 + 4 + (long)plVar23);
        plVar21 = (long *)src;
      } while (plVar1 < src);
      pUVar5[(ulong)(*(long *)(pBVar6 + (uVar14 & 0xffffffff) + 2) * -0x30e4432345000000) >>
             (bVar9 & 0x3f)] = UVar13 + 2;
      pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar9 & 0x3f)] =
           ((int)src + -2) - iVar22;
      uVar11 = (ulong)uVar19;
      while( true ) {
        uVar14 = (ulong)local_94;
        uVar19 = (uint)uVar11;
        plVar21 = (long *)src;
        if (plVar1 < src) break;
        if ((local_94 == 0) || ((int)*src != *(int *)((long)src - uVar14))) break;
        sVar8 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar14)),pInLimit);
        pUVar5[(ulong)(*src * -0x30e4432345000000) >> (bVar9 & 0x3f)] = (int)src - iVar22;
        ZSTD_storeSeq(seqStore,0,src,0,sVar8 + 1);
        src = (void *)((long)src + sVar8 + 4);
        uVar11 = uVar14;
        local_94 = uVar19;
      }
    } while( true );
  }
  if (uVar16 == 6) {
    bVar9 = 0x40 - cVar7;
    do {
      do {
        while( true ) {
          if (plVar1 <= plVar21) goto LAB_001517aa;
          uVar11 = (ulong)(*plVar21 * -0x30e4432340650000) >> (bVar9 & 0x3f);
          uVar14 = (long)plVar21 - (long)pBVar6;
          uVar16 = pUVar5[uVar11];
          UVar13 = (U32)uVar14;
          pUVar5[uVar11] = UVar13;
          if ((uVar19 != 0) &&
             (*(int *)((long)plVar21 + -(ulong)uVar19 + 1) == *(int *)((long)plVar21 + 1))) {
            plVar23 = (long *)((long)plVar21 + 1);
            sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 5),
                               (BYTE *)((long)plVar21 + -(ulong)uVar19 + 5),pInLimit);
            ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar8 + 1);
            uVar16 = uVar19;
            goto LAB_00151226;
          }
          if ((uVar2 < uVar16) && (piVar12 = (int *)(pBVar6 + uVar16), *piVar12 == (int)*plVar21))
          break;
          plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + uVar17);
        }
        sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar12 + 1),pInLimit);
        uVar16 = (int)plVar21 - (int)piVar12;
        for (lVar18 = 0;
            ((plVar23 = (long *)(lVar18 + (long)plVar21), pBVar20 < (BYTE *)((long)piVar12 + lVar18)
             && (src < plVar23)) &&
            (*(char *)((long)plVar21 + lVar18 + -1) == *(char *)((long)piVar12 + lVar18 + -1)));
            lVar18 = lVar18 + -1) {
        }
        sVar8 = sVar8 - lVar18;
        ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar16 + 2,sVar8 + 1);
        local_94 = uVar19;
LAB_00151226:
        uVar19 = uVar16;
        src = (void *)(sVar8 + 4 + (long)plVar23);
        plVar21 = (long *)src;
      } while (plVar1 < src);
      pUVar5[(ulong)(*(long *)(pBVar6 + (uVar14 & 0xffffffff) + 2) * -0x30e4432340650000) >>
             (bVar9 & 0x3f)] = UVar13 + 2;
      pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar9 & 0x3f)] =
           ((int)src + -2) - iVar22;
      uVar11 = (ulong)uVar19;
      while( true ) {
        uVar14 = (ulong)local_94;
        uVar19 = (uint)uVar11;
        plVar21 = (long *)src;
        if (plVar1 < src) break;
        if ((local_94 == 0) || ((int)*src != *(int *)((long)src - uVar14))) break;
        sVar8 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar14)),pInLimit);
        pUVar5[(ulong)(*src * -0x30e4432340650000) >> (bVar9 & 0x3f)] = (int)src - iVar22;
        ZSTD_storeSeq(seqStore,0,src,0,sVar8 + 1);
        src = (void *)((long)src + sVar8 + 4);
        uVar11 = uVar14;
        local_94 = uVar19;
      }
    } while( true );
  }
  if (uVar16 != 7) {
    bVar9 = 0x20 - cVar7;
    do {
      do {
        while( true ) {
          if (plVar1 <= plVar21) goto LAB_001517aa;
          uVar10 = (uint)((int)*plVar21 * -0x61c8864f) >> (bVar9 & 0x1f);
          uVar11 = (long)plVar21 - (long)pBVar6;
          uVar16 = pUVar5[uVar10];
          UVar13 = (U32)uVar11;
          pUVar5[uVar10] = UVar13;
          if ((uVar19 != 0) &&
             (*(int *)((long)plVar21 + -(ulong)uVar19 + 1) == *(int *)((long)plVar21 + 1))) {
            plVar23 = (long *)((long)plVar21 + 1);
            sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 5),
                               (BYTE *)((long)plVar21 + -(ulong)uVar19 + 5),pInLimit);
            ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar8 + 1);
            uVar16 = uVar19;
            goto LAB_00151692;
          }
          if ((uVar2 < uVar16) && (piVar12 = (int *)(pBVar6 + uVar16), *piVar12 == (int)*plVar21))
          break;
          plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + uVar17);
        }
        sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar12 + 1),pInLimit);
        uVar16 = (int)plVar21 - (int)piVar12;
        for (lVar18 = 0;
            ((plVar23 = (long *)(lVar18 + (long)plVar21), pBVar20 < (BYTE *)((long)piVar12 + lVar18)
             && (src < plVar23)) &&
            (*(char *)((long)plVar21 + lVar18 + -1) == *(char *)((long)piVar12 + lVar18 + -1)));
            lVar18 = lVar18 + -1) {
        }
        sVar8 = sVar8 - lVar18;
        ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar16 + 2,sVar8 + 1);
        local_94 = uVar19;
LAB_00151692:
        uVar19 = uVar16;
        src = (void *)(sVar8 + 4 + (long)plVar23);
        plVar21 = (long *)src;
      } while (plVar1 < src);
      pUVar5[(uint)(*(int *)(pBVar6 + (uVar11 & 0xffffffff) + 2) * -0x61c8864f) >> (bVar9 & 0x1f)] =
           UVar13 + 2;
      pUVar5[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar9 & 0x1f)] =
           ((int)src + -2) - iVar22;
      uVar11 = (ulong)uVar19;
      while( true ) {
        uVar14 = (ulong)local_94;
        uVar19 = (uint)uVar11;
        plVar21 = (long *)src;
        if (plVar1 < src) break;
        lVar18 = *src;
        if ((local_94 == 0) || ((int)lVar18 != *(int *)((long)src - uVar14))) break;
        sVar8 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar14)),pInLimit);
        pUVar5[(uint)((int)lVar18 * -0x61c8864f) >> (bVar9 & 0x1f)] = (int)src - iVar22;
        ZSTD_storeSeq(seqStore,0,src,0,sVar8 + 1);
        src = (void *)((long)src + sVar8 + 4);
        uVar11 = uVar14;
        local_94 = uVar19;
      }
    } while( true );
  }
  bVar9 = 0x40 - cVar7;
LAB_00150ec9:
  do {
    if (plVar1 <= plVar21) {
LAB_001517aa:
      uVar16 = 0;
      if (uVar15 < uVar3) {
        uVar16 = uVar3;
      }
      if (uVar15 < uVar4) {
        uVar16 = uVar4;
      }
      if (uVar19 == 0) {
        uVar19 = uVar16;
      }
      if (local_94 != 0) {
        uVar16 = local_94;
      }
      *rep = uVar19;
      rep[1] = uVar16;
      return (long)pInLimit - (long)src;
    }
    uVar11 = (ulong)(*plVar21 * -0x30e44323405a9d00) >> (bVar9 & 0x3f);
    uVar14 = (long)plVar21 - (long)pBVar6;
    uVar16 = pUVar5[uVar11];
    UVar13 = (U32)uVar14;
    pUVar5[uVar11] = UVar13;
    if ((uVar19 != 0) &&
       (*(int *)((long)plVar21 + -(ulong)uVar19 + 1) == *(int *)((long)plVar21 + 1))) {
      plVar23 = (long *)((long)plVar21 + 1);
      sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 5),(BYTE *)((long)plVar21 + -(ulong)uVar19 + 5),
                         pInLimit);
      ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar8 + 1);
      uVar16 = uVar19;
      goto LAB_00150fe2;
    }
    if ((uVar2 < uVar16) && (piVar12 = (int *)(pBVar6 + uVar16), *piVar12 == (int)*plVar21)) break;
    plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + uVar17);
  } while( true );
  sVar8 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar12 + 1),pInLimit);
  uVar16 = (int)plVar21 - (int)piVar12;
  for (lVar18 = 0;
      ((plVar23 = (long *)(lVar18 + (long)plVar21), pBVar20 < (BYTE *)((long)piVar12 + lVar18) &&
       (src < plVar23)) &&
      (*(char *)((long)plVar21 + lVar18 + -1) == *(char *)((long)piVar12 + lVar18 + -1)));
      lVar18 = lVar18 + -1) {
  }
  sVar8 = sVar8 - lVar18;
  ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar16 + 2,sVar8 + 1);
  local_94 = uVar19;
LAB_00150fe2:
  uVar19 = uVar16;
  src = (void *)(sVar8 + 4 + (long)plVar23);
  plVar21 = (long *)src;
  if (src <= plVar1) {
    pUVar5[(ulong)(*(long *)(pBVar6 + (uVar14 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
           (bVar9 & 0x3f)] = UVar13 + 2;
    pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar9 & 0x3f)] =
         ((int)src + -2) - iVar22;
    uVar11 = (ulong)uVar19;
    while( true ) {
      uVar14 = (ulong)local_94;
      uVar19 = (uint)uVar11;
      plVar21 = (long *)src;
      if (plVar1 < src) break;
      if ((local_94 == 0) || ((int)*src != *(int *)((long)src - uVar14))) break;
      sVar8 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar14)),pInLimit);
      pUVar5[(ulong)(*src * -0x30e44323405a9d00) >> (bVar9 & 0x3f)] = (int)src - iVar22;
      ZSTD_storeSeq(seqStore,0,src,0,sVar8 + 1);
      src = (void *)((long)src + sVar8 + 4);
      uVar11 = uVar14;
      local_94 = uVar19;
    }
  }
  goto LAB_00150ec9;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    U32 const hlog = cParams->hashLog;
    U32 const mls = cParams->searchLength;
    U32 const stepSize = cParams->targetLength;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 7);
    }
}